

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::DescriptorPool::Tables::AddCheckpoint(Tables *this)

{
  CheckPoint local_2c;
  Tables *local_10;
  Tables *this_local;
  
  local_10 = this;
  CheckPoint::CheckPoint(&local_2c,this);
  std::
  vector<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
  ::push_back(&this->checkpoints_,&local_2c);
  return;
}

Assistant:

void DescriptorPool::Tables::AddCheckpoint() {
  checkpoints_.push_back(CheckPoint(this));
}